

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O3

int scanPastString(char *buffer,int buffer_len,int offset,int *lines)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  bool bVar11;
  byte bVar12;
  int needle_len;
  ulong uVar13;
  long in_FS_OFFSET;
  int matchlen;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (offset < 1) {
    cVar9 = buffer[offset];
  }
  else {
    uVar13 = (ulong)(uint)offset;
    cVar9 = buffer[uVar13];
    if (cVar9 == '\"') {
      uVar4 = offset - 1;
      bVar3 = false;
      bVar11 = false;
      bVar8 = false;
      do {
        if (uVar4 == 0) {
LAB_00196a7b:
          bVar12 = 0;
LAB_00196a7e:
          if (bVar11) {
            if (buffer[uVar4] != 'u') {
LAB_00196b0f:
              if (bVar3) {
                cVar9 = buffer[uVar4];
                iVar5 = isalnum((int)cVar9);
                if (iVar5 != 0) {
                  bVar3 = false;
                }
                if (cVar9 == 0x5f) {
                  bVar3 = false;
                }
              }
              break;
            }
            bVar8 = true;
LAB_00196a95:
            iVar5 = -1;
            bVar11 = false;
          }
          else {
            if (bVar8) goto LAB_00196b0f;
            bVar1 = buffer[uVar4];
            iVar5 = -1;
            if ((bool)(bVar12 & bVar1 == 0x38)) {
              bVar11 = true;
              bVar8 = false;
            }
            else {
              bVar8 = true;
              bVar11 = false;
              if (bVar1 < 0x55) {
                if (bVar1 != 0x4c) {
                  if ((bVar1 == 0x52) && (!bVar3)) {
                    bVar3 = true;
                    bVar8 = false;
                    goto LAB_00196a95;
                  }
                  goto LAB_00196b0f;
                }
              }
              else if ((bVar1 != 0x55) && (bVar1 != 0x75)) goto LAB_00196b0f;
            }
          }
        }
        else {
          cVar9 = buffer[uVar4];
          if (((cVar9 != '\r') && (cVar9 != '\n')) || (iVar5 = -2, buffer[(ulong)uVar4 - 1] != '\\')
             ) {
            if (uVar4 == 1) goto LAB_00196a7b;
            bVar12 = 1;
            if (((cVar9 == '\n') && (buffer[(ulong)uVar4 - 1] == '\r')) &&
               (iVar5 = -3, buffer[(ulong)uVar4 - 2] == '\\')) goto LAB_00196ab6;
            goto LAB_00196a7e;
          }
        }
LAB_00196ab6:
        uVar4 = uVar4 + iVar5;
      } while (-1 < (int)uVar4);
      cVar9 = '\"';
      if (bVar3) {
        uVar6 = skipEscapedLineEnds(buffer,buffer_len,offset + 1,lines);
        uVar13 = (long)(int)uVar6;
        uVar4 = uVar6;
        if ((int)uVar6 < buffer_len) {
          do {
            if (buffer[(int)uVar4] == '(') break;
            if ((long)uVar13 < (long)(int)uVar4) {
              buffer[uVar13] = buffer[(int)uVar4];
            }
            uVar13 = uVar13 + 1;
            uVar4 = skipEscapedLineEnds(buffer,buffer_len,uVar4 + 1,lines);
          } while ((int)uVar4 < buffer_len);
        }
        else {
          uVar13 = (ulong)uVar6;
        }
        needle_len = (int)uVar13 - uVar6;
        local_40 = 0;
        local_3c = needle_len;
        iVar7 = skipEscapedLineEnds(buffer,buffer_len,uVar4 + 1,lines);
        iVar5 = needle_len;
        iVar10 = 0;
        if (iVar7 < buffer_len) {
          do {
            cVar9 = buffer[iVar7];
            if ((cVar9 == '\n') || (cVar9 == '\r')) {
              *lines = *lines + 1;
            }
            else if ((cVar9 == ')') &&
                    (((needle_len < 1 ||
                      (bVar3 = matchWhileUnsplitting
                                         (buffer,buffer_len,iVar7 + 1,buffer + (int)uVar6,needle_len
                                          ,&local_3c,&local_40), bVar3)) &&
                     (iVar5 = local_3c, iVar10 = local_40, buffer[iVar7 + 1 + local_3c] == '\"'))))
            goto LAB_00196cf2;
            local_40 = 0;
            iVar7 = skipEscapedLineEnds(buffer,buffer_len,iVar7 + 1,lines);
          } while (iVar7 < buffer_len);
          iVar5 = local_3c;
          iVar10 = 0;
        }
LAB_00196cf2:
        *lines = *lines + iVar10;
        iVar5 = iVar5 + iVar7 + 1;
        goto LAB_00196cf9;
      }
    }
    else if ((((0xfffffff5 < (byte)buffer[uVar13 - 1] - 0x3a) && ((int)(uVar13 + 1) < buffer_len))
             && (0xfffffff5 < (byte)buffer[uVar13 + 1] - 0x3a)) &&
            (((iVar5 = 1, offset == 1 || (iVar5 = offset, buffer[uVar13 - 1] != 0x38)) ||
             (buffer[uVar13 - 2] != 'u')))) goto LAB_00196cf9;
  }
  while ((iVar10 = offset, iVar5 = iVar10 + 1, iVar5 < buffer_len &&
         (cVar2 = buffer[iVar5], cVar2 != cVar9))) {
    offset = iVar5;
    if ((cVar2 == '\n') || (cVar2 == '\r')) {
      *lines = *lines + 1;
    }
    else if (cVar2 == '\\') {
      offset = iVar10 + 2;
    }
  }
LAB_00196cf9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int scanPastString(char *buffer, int buffer_len, int offset, int *lines)
{
    // http://en.cppreference.com/w/cpp/language/string_literal
    // It might be a C++11 raw string.
    bool israw = false;

    Q_ASSERT(offset < buffer_len);
    if (offset <= 0) {
        // skip, neither of these special cases applies here
    } else if (buffer[offset] == '"') {
        int explore = offset - 1;
        bool prefix = false; // One of L, U, u or u8 may appear before R
        bool saw8 = false; // Partial scan of u8
        while (explore >= 0) {
            // Cope with backslash-newline interruptions of the prefix:
            if (explore > 0
                && qmake_endOfLine(buffer[explore])
                && buffer[explore - 1] == '\\') {
                explore -= 2;
            } else if (explore > 1
                       && buffer[explore] == '\n'
                       && buffer[explore - 1] == '\r'
                       && buffer[explore - 2] == '\\') {
                explore -= 3;
                // Remaining cases can only decrement explore by one at a time:
            } else if (saw8 && buffer[explore] == 'u') {
                explore--;
                saw8 = false;
                prefix = true;
            } else if (saw8 || prefix) {
                break;
            } else if (explore > 1 && buffer[explore] == '8') {
                explore--;
                saw8 = true;
            } else if (buffer[explore] == 'L'
                       || buffer[explore] == 'U'
                       || buffer[explore] == 'u') {
                explore--;
                prefix = true;
            } else if (buffer[explore] == 'R') {
                if (israw)
                    break;
                explore--;
                israw = true;
            } else {
                break;
            }
        }
        // Check the R (with possible prefix) isn't just part of an identifier:
        if (israw && explore >= 0
            && (isalnum(buffer[explore]) || buffer[explore] == '_')) {
            israw = false;
        }

    } else {
        // Is this apostrophe a digit separator rather than the start of a
        // character literal ? If so, there was no string to scan past, so
        // treat the apostrophe as both open and close.
        Q_ASSERT(buffer[offset] == '\'' && offset > 0);
        // Wrap std::isdigit() to package the casting to unsigned char.
        const auto isDigit = [](unsigned char c) { return std::isdigit(c); };
        if (isDigit(buffer[offset - 1]) && offset + 1 < buffer_len && isDigit(buffer[offset + 1])) {
            // One exception: u8'0' is a perfectly good character literal.
            if (offset < 2 || buffer[offset - 1] != '8' || buffer[offset - 2] != 'u')
                return offset;
        }
    }

    if (israw) {
#define SKIP_BSNL(pos) skipEscapedLineEnds(buffer, buffer_len, (pos), lines)

        offset = SKIP_BSNL(offset + 1);
        const char *const delim = buffer + offset;
        int clean = offset;
        while (offset < buffer_len && buffer[offset] != '(') {
            if (clean < offset)
                buffer[clean++] = buffer[offset];
            else
                clean++;

            offset = SKIP_BSNL(offset + 1);
        }
        /*
          Not checking correctness (trust real compiler to do that):
          - no controls, spaces, '(', ')', '\\' or (presumably) '"' in delim;
          - at most 16 bytes in delim

          Raw strings are surely defined after phase 2, when BSNLs are resolved;
          so the delimiter's exclusion of '\\' and space (including newlines)
          applies too late to save us the need to cope with BSNLs in it.
        */

        const int delimlen = buffer + clean - delim;
        int matchlen = delimlen, extralines = 0;
        while ((offset = SKIP_BSNL(offset + 1)) < buffer_len
               && (buffer[offset] != ')'
                   || (delimlen > 0 &&
                       !matchWhileUnsplitting(buffer, buffer_len,
                                              offset + 1, delim, delimlen,
                                              &matchlen, &extralines))
                   || buffer[offset + 1 + matchlen] != '"')) {
            // skip, but keep track of lines
            if (qmake_endOfLine(buffer[offset]))
                ++*lines;
            extralines = 0;
        }
        *lines += extralines; // from the match
        // buffer[offset] is ')'
        offset += 1 + matchlen; // 1 for ')', then delim
        // buffer[offset] is '"'

#undef SKIP_BSNL
    } else { // Traditional string or char literal:
        const char term = buffer[offset];
        while (++offset < buffer_len && buffer[offset] != term) {
            if (buffer[offset] == '\\')
                ++offset;
            else if (qmake_endOfLine(buffer[offset]))
                ++*lines;
        }
    }

    return offset;
}